

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_col_block_list(Integer s_a,Integer **idx,Integer *n)

{
  _sparse_array *p_Var1;
  Integer *pIVar2;
  long lVar3;
  
  lVar3 = SPA[s_a + 1000].nblocks;
  *n = lVar3;
  pIVar2 = (Integer *)malloc(lVar3 << 3);
  *idx = pIVar2;
  p_Var1 = SPA;
  for (lVar3 = 0; lVar3 < p_Var1[s_a + 1000].nblocks; lVar3 = lVar3 + 1) {
    pIVar2[lVar3] = p_Var1[s_a + 1000].blkidx[lVar3];
  }
  return;
}

Assistant:

void pnga_sprs_array_col_block_list(Integer s_a, Integer **idx, Integer *n)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer i, index;
  *n = SPA[hdl].nblocks;
  *idx = (Integer*)malloc(SPA[hdl].nblocks*sizeof(Integer));
  for (i=0; i<SPA[hdl].nblocks; i++) {
    (*idx)[i] = SPA[hdl].blkidx[i];
  }
}